

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
CQueue::
AddToQueue<void(*)(char_data*,char_data*,speech_data*),char_data*&,char_data*&,speech_data*&>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_char_data_ptr_char_data_ptr_speech_data_ptr *func,char_data **args,
          char_data **args_1,speech_data **args_2)

{
  string_view fmt;
  string_view fmt_00;
  int nTimer_local;
  string *local_110;
  _func_void_char_data_ptr_char_data_ptr_speech_data_ptr *local_108;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  undefined1 local_e8 [40];
  string local_c0 [32];
  vector<char_data_*,_std::allocator<char_data_*>_> local_a0;
  function<void()> local_88 [32];
  tuple<char_data_*&,_char_data_*&,_speech_data_*&> tuple;
  undefined1 local_50 [24];
  speech_data *local_38;
  
  nTimer_local = nTimer;
  local_110 = funcName;
  local_108 = func;
  if (nTimer < 0) {
    local_e8._0_8_ = 3;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_e8);
  }
  tuple.super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_speech_data_*&>.
  super__Tuple_impl<1UL,_char_data_*&,_speech_data_*&>.super__Tuple_impl<2UL,_speech_data_*&>.
  super__Head_base<2UL,_speech_data_*&,_false>._M_head_impl =
       (_Head_base<2UL,_speech_data_*&,_false>)(_Head_base<2UL,_speech_data_*&,_false>)args_2;
  tuple.super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_speech_data_*&>.
  super__Tuple_impl<1UL,_char_data_*&,_speech_data_*&>.super__Head_base<1UL,_char_data_*&,_false>.
  _M_head_impl = args_1;
  tuple.super__Tuple_impl<0UL,_char_data_*&,_char_data_*&,_speech_data_*&>.
  super__Head_base<0UL,_char_data_*&,_false>._M_head_impl = args;
  GetCharacterData<char_data*&,char_data*&,speech_data*&>(&chs,this,&tuple);
  local_e8._0_4_ = nTimer;
  std::__cxx11::string::string((string *)(local_e8 + 8),(string *)from);
  std::__cxx11::string::string(local_c0,(string *)local_110);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_a0,&chs);
  local_50._0_8_ = local_108;
  local_50._8_8_ = *args;
  local_50._16_8_ = *args_1;
  local_38 = *args_2;
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(char_data*,char_data*,speech_data*),char_data*&,char_data*&,speech_data*&>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,char_data*,speech_data*),char_data*&,char_data*&,speech_data*&)::_lambda()_1_,void>
            (local_88,(anon_class_32_4_d738bd32 *)local_50);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&this->newQueue,(queueEntry_t *)local_e8);
  queueEntry_t::~queueEntry_t((queueEntry_t *)local_e8);
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,from,local_110,&nTimer_local);
  std::_Vector_base<char_data_*,_std::allocator<char_data_*>_>::~_Vector_base
            (&chs.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}